

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O3

int writeString(FILE *stream,writeoutvar *wovar,per_transfer *per,CURLcode per_result,_Bool use_json
               )

{
  CURLINFO CVar1;
  writeoutid wVar2;
  int iVar3;
  CURLcode CVar4;
  long lVar5;
  size_t sVar6;
  curl_certinfo *pcVar7;
  char *__s;
  int *piVar8;
  bool bVar9;
  char *pcVar10;
  undefined3 in_register_00000081;
  undefined4 uVar11;
  curl_slist *pcVar12;
  long version;
  dynbuf buf;
  char *local_78;
  undefined4 local_6c;
  char *local_68;
  char *local_60;
  FILE *local_58;
  dynbuf local_50;
  
  uVar11 = CONCAT31(in_register_00000081,use_json);
  local_78 = (char *)0x0;
  curlx_dyn_init(&local_50,0x40000);
  CVar1 = wovar->ci;
  local_6c = uVar11;
  if (CVar1 == CURLINFO_NONE) {
    wVar2 = wovar->id;
    if (wVar2 - VAR_INPUT_URLSCHEME < 0x14) {
      if ((per->url == (char *)0x0) || (lVar5 = curl_url(), lVar5 == 0)) goto LAB_0011ea92;
      local_60 = (char *)0x0;
      local_68 = (char *)0x0;
      if (wVar2 < VAR_INPUT_URLESCHEME) {
        local_68 = per->url;
LAB_0011ea20:
        uVar11 = *(undefined4 *)("urle.user" + (long)(int)wVar2 * 4 + 8);
        iVar3 = curl_url_set(lVar5,0,local_68,0x208);
        if ((iVar3 == 0) &&
           (iVar3 = curl_url_get(lVar5,uVar11,&local_60,1), pcVar10 = local_60,
           local_60 != (char *)0x0 && iVar3 == 0)) {
          local_78 = local_60;
          curl_url_cleanup(lVar5);
          bVar9 = true;
          __s = pcVar10;
          goto LAB_0011ebf6;
        }
      }
      else {
        iVar3 = curl_easy_getinfo(per->curl,0x100001,&local_68);
        if (iVar3 == 0) goto LAB_0011ea20;
      }
      curl_url_cleanup(lVar5);
LAB_0011ea92:
      pcVar10 = (char *)0x0;
    }
    else {
      pcVar10 = (char *)0x0;
      if ((int)wVar2 < 10) {
        if (wVar2 == VAR_CERT) {
          certinfo(per);
          pcVar7 = per->certinfo;
          if (pcVar7 == (curl_certinfo *)0x0) {
            local_78 = "";
            goto LAB_0011ea92;
          }
          iVar3 = pcVar7->num_of_certs;
          if (0 < iVar3) {
            lVar5 = 0;
            local_58 = (FILE *)stream;
            do {
              pcVar12 = pcVar7->certinfo[lVar5];
              if (pcVar12 == (curl_slist *)0x0) {
                bVar9 = false;
              }
              else {
                do {
                  iVar3 = curl_strnequal(pcVar12->data,"cert:",5);
                  pcVar10 = pcVar12->data;
                  if (iVar3 != 0) {
                    pcVar10 = pcVar10 + 5;
                  }
                  CVar4 = curlx_dyn_add(&local_50,pcVar10);
                  if ((CVar4 != CURLE_OK) ||
                     (((sVar6 = curlx_dyn_len(&local_50), sVar6 != 0 &&
                       (pcVar10 = curlx_dyn_ptr(&local_50), pcVar10[sVar6 - 1] != '\n')) &&
                      (CVar4 = curlx_dyn_addn(&local_50,"\n",1), CVar4 != CURLE_OK)))) {
                    bVar9 = true;
                    goto LAB_0011eb81;
                  }
                  pcVar12 = pcVar12->next;
                } while (pcVar12 != (curl_slist *)0x0);
                bVar9 = false;
LAB_0011eb81:
                pcVar7 = per->certinfo;
                iVar3 = pcVar7->num_of_certs;
              }
              lVar5 = lVar5 + 1;
            } while ((lVar5 < iVar3) && (!bVar9));
            stream = (FILE *)local_58;
            if (bVar9) {
              __s = (char *)0x0;
              pcVar10 = (char *)0x0;
              bVar9 = false;
              goto LAB_0011ebf6;
            }
          }
          pcVar10 = curlx_dyn_ptr(&local_50);
          __s = "";
          if (pcVar10 != (char *)0x0) {
            __s = pcVar10;
          }
        }
        else {
          if (wVar2 != VAR_EFFECTIVE_FILENAME) goto LAB_0011ec2a;
          __s = (per->outs).filename;
LAB_0011eac6:
          if (__s == (char *)0x0) goto LAB_0011ea92;
        }
LAB_0011ebed:
        bVar9 = true;
        local_78 = __s;
        goto LAB_0011ebf3;
      }
      if (wVar2 == VAR_ERRORMSG) {
        if (per_result == CURLE_OK) goto LAB_0011ea92;
        __s = per->errorbuffer;
        if ((__s == (char *)0x0) || (*__s == '\0')) {
          __s = (char *)curl_easy_strerror(per_result);
        }
        goto LAB_0011ebed;
      }
      if (wVar2 == VAR_INPUT_URL) {
        __s = per->url;
        goto LAB_0011eac6;
      }
    }
  }
  else {
    if (CVar1 == CURLINFO_HTTP_VERSION) {
      local_60 = (char *)0x0;
      bVar9 = false;
      iVar3 = curl_easy_getinfo(per->curl,0x20002e);
      if (iVar3 == 0) {
        if (local_60 == (char *)0x0) {
          __s = "0";
        }
        else {
          piVar8 = &http_version[1].num;
          do {
            __s = ((httpmap *)(piVar8 + -2))->str;
            if (__s == (char *)0x0) {
              __s = (char *)0x0;
              bVar9 = false;
              goto LAB_0011ebf3;
            }
            iVar3 = *piVar8;
            piVar8 = piVar8 + 4;
          } while (local_60 != (char *)(long)iVar3);
        }
        goto LAB_0011ebed;
      }
      __s = (char *)0x0;
LAB_0011ebf3:
      pcVar10 = (char *)0x0;
    }
    else {
      pcVar10 = (char *)0x0;
      iVar3 = curl_easy_getinfo(per->curl,CVar1,&local_78);
      bVar9 = local_78 != (char *)0x0 && iVar3 == 0;
      __s = local_78;
    }
LAB_0011ebf6:
    if ((bVar9) && (__s != (char *)0x0)) {
      if ((char)local_6c == '\0') {
        fputs(__s,(FILE *)stream);
      }
      else {
        curl_mfprintf(stream,"\"%s\":",wovar->name);
        jsonWriteString(stream,local_78,false);
      }
      goto LAB_0011ec52;
    }
  }
LAB_0011ec2a:
  if ((char)local_6c != '\0') {
    curl_mfprintf(stream,"\"%s\":null",wovar->name);
  }
LAB_0011ec52:
  curl_free(pcVar10);
  curlx_dyn_free(&local_50);
  return 1;
}

Assistant:

static int writeString(FILE *stream, const struct writeoutvar *wovar,
                       struct per_transfer *per, CURLcode per_result,
                       bool use_json)
{
  bool valid = false;
  const char *strinfo = NULL;
  const char *freestr = NULL;
  struct dynbuf buf;
  curlx_dyn_init(&buf, 256*1024);

  DEBUGASSERT(wovar->writefunc == writeString);

  if(wovar->ci) {
    if(wovar->ci == CURLINFO_HTTP_VERSION) {
      long version = 0;
      if(!curl_easy_getinfo(per->curl, CURLINFO_HTTP_VERSION, &version)) {
        const struct httpmap *m = &http_version[0];
        while(m->str) {
          if(m->num == version) {
            strinfo = m->str;
            valid = true;
            break;
          }
          m++;
        }
      }
    }
    else {
      if(!curl_easy_getinfo(per->curl, wovar->ci, &strinfo) && strinfo)
        valid = true;
    }
  }
  else {
    switch(wovar->id) {
    case VAR_CERT:
      certinfo(per);
      if(per->certinfo) {
        int i;
        bool error = FALSE;
        for(i = 0; (i < per->certinfo->num_of_certs) && !error; i++) {
          struct curl_slist *slist;

          for(slist = per->certinfo->certinfo[i]; slist; slist = slist->next) {
            size_t len;
            if(curl_strnequal(slist->data, "cert:", 5)) {
              if(curlx_dyn_add(&buf, &slist->data[5])) {
                error = TRUE;
                break;
              }
            }
            else {
              if(curlx_dyn_add(&buf, slist->data)) {
                error = TRUE;
                break;
              }
            }
            len = curlx_dyn_len(&buf);
            if(len) {
              char *ptr = curlx_dyn_ptr(&buf);
              if(ptr[len -1] != '\n') {
                /* add a newline to make things look better */
                if(curlx_dyn_addn(&buf, "\n", 1)) {
                  error = TRUE;
                  break;
                }
              }
            }
          }
        }
        if(!error) {
          strinfo = curlx_dyn_ptr(&buf);
          if(!strinfo)
            /* maybe not a TLS protocol */
            strinfo = "";
          valid = true;
        }
      }
      else
        strinfo = ""; /* no cert info */
      break;
    case VAR_ERRORMSG:
      if(per_result) {
        strinfo = (per->errorbuffer && per->errorbuffer[0]) ?
          per->errorbuffer : curl_easy_strerror(per_result);
        valid = true;
      }
      break;
    case VAR_EFFECTIVE_FILENAME:
      if(per->outs.filename) {
        strinfo = per->outs.filename;
        valid = true;
      }
      break;
    case VAR_INPUT_URL:
      if(per->url) {
        strinfo = per->url;
        valid = true;
      }
      break;
    case VAR_INPUT_URLSCHEME:
    case VAR_INPUT_URLUSER:
    case VAR_INPUT_URLPASSWORD:
    case VAR_INPUT_URLOPTIONS:
    case VAR_INPUT_URLHOST:
    case VAR_INPUT_URLPORT:
    case VAR_INPUT_URLPATH:
    case VAR_INPUT_URLQUERY:
    case VAR_INPUT_URLFRAGMENT:
    case VAR_INPUT_URLZONEID:
    case VAR_INPUT_URLESCHEME:
    case VAR_INPUT_URLEUSER:
    case VAR_INPUT_URLEPASSWORD:
    case VAR_INPUT_URLEOPTIONS:
    case VAR_INPUT_URLEHOST:
    case VAR_INPUT_URLEPORT:
    case VAR_INPUT_URLEPATH:
    case VAR_INPUT_URLEQUERY:
    case VAR_INPUT_URLEFRAGMENT:
    case VAR_INPUT_URLEZONEID:
      if(per->url) {
        if(!urlpart(per, wovar->id, &strinfo)) {
          freestr = strinfo;
          valid = true;
        }
      }
      break;
    default:
      DEBUGASSERT(0);
      break;
    }
  }

  DEBUGASSERT(!valid || strinfo);
  if(valid && strinfo) {
    if(use_json) {
      fprintf(stream, "\"%s\":", wovar->name);
      jsonWriteString(stream, strinfo, FALSE);
    }
    else
      fputs(strinfo, stream);
  }
  else {
    if(use_json)
      fprintf(stream, "\"%s\":null", wovar->name);
  }
  curl_free((char *)CURL_UNCONST(freestr));

  curlx_dyn_free(&buf);
  return 1; /* return 1 if anything was written */
}